

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content<httplib::Response>
               (Stream *strm,Response *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiverWithProgress *receiver,bool decompress)

{
  bool bVar1;
  bool in_stack_00000017;
  ContentReceiverWithProgress *in_stack_00000018;
  int *in_stack_00000020;
  Response *in_stack_00000028;
  anon_class_40_5_1ac14285 in_stack_00000040;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
  *in_stack_ffffffffffffff18;
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>
  *in_stack_ffffffffffffff20;
  
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar1 = prepare_content_receiver<httplib::Response,httplib::detail::read_content<httplib::Response>(httplib::Stream&,httplib::Response&,unsigned_long,int&,std::function<bool(unsigned_long,unsigned_long)>,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>,bool)::_lambda(std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>const&)_1_>
                    (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000017,
                     in_stack_00000040);
  std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)0x127d28)
  ;
  return bVar1;
}

Assistant:

bool read_content(Stream& strm, T& x, size_t payload_max_length, int& status,
            Progress progress, ContentReceiverWithProgress receiver,
            bool decompress) {
            return prepare_content_receiver(
                x, status, std::move(receiver), decompress,
                [&](const ContentReceiverWithProgress& out) {
                auto ret = true;
                auto exceed_payload_max_length = false;

                if (is_chunked_transfer_encoding(x.headers)) {
                    ret = read_content_chunked(strm, out);
                } else if (!has_header(x.headers, "Content-Length")) {
                    ret = read_content_without_length(strm, out);
                } else {
                    auto len = get_header_value<uint64_t>(x.headers, "Content-Length");
                    if (len > payload_max_length) {
                        exceed_payload_max_length = true;
                        skip_content_with_length(strm, len);
                        ret = false;
                    } else if (len > 0) {
                        ret = read_content_with_length(strm, len, std::move(progress), out);
                    }
                }

                if (!ret) { status = exceed_payload_max_length ? 413 : 400; }
                return ret;
            });
        }